

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_wipe_key_slot(psa_key_slot_t *slot)

{
  ushort uVar1;
  psa_status_t pVar2;
  
  uVar1 = (slot->attr).type;
  pVar2 = 0;
  if (uVar1 != 0) {
    if (((uVar1 & 0x7000) != 0x2000) && ((uVar1 & 0x7000) != 0x1000)) {
      if ((uVar1 & 0xcfff) == 0x4001) {
        mbedtls_rsa_free((slot->data).rsa);
      }
      else {
        pVar2 = -0x97;
        if ((uVar1 & 0xcf00) != 0x4100) goto LAB_00112139;
        mbedtls_ecp_keypair_free((slot->data).ecp);
      }
    }
    free((slot->data).raw.data);
    pVar2 = 0;
  }
LAB_00112139:
  (slot->data).raw.data = (uint8_t *)0x0;
  (slot->data).raw.bytes = 0;
  (slot->attr).policy.alg = 0;
  (slot->attr).policy.alg2 = 0;
  *(undefined8 *)&(slot->attr).flags = 0;
  (slot->attr).type = 0;
  (slot->attr).bits = 0;
  (slot->attr).lifetime = 0;
  (slot->attr).id = 0;
  (slot->attr).policy.usage = 0;
  return pVar2;
}

Assistant:

psa_status_t psa_wipe_key_slot( psa_key_slot_t *slot )
{
    psa_status_t status = psa_remove_key_data_from_memory( slot );
    /* Multipart operations may still be using the key. This is safe
     * because all multipart operation objects are independent from
     * the key slot: if they need to access the key after the setup
     * phase, they have a copy of the key. Note that this means that
     * key material can linger until all operations are completed. */
    /* At this point, key material and other type-specific content has
     * been wiped. Clear remaining metadata. We can call memset and not
     * zeroize because the metadata is not particularly sensitive. */
    memset( slot, 0, sizeof( *slot ) );
    return( status );
}